

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolylineSegmentedPath.cpp
# Opt level: O2

void __thiscall
OpenSteer::PolylineSegmentedPath::mapPointToSegmentDistanceAndPointAndTangent
          (PolylineSegmentedPath *this,size_type segmentIndex,Vec3 *point,float *distance,
          Vec3 *pointOnPath,Vec3 *tangent)

{
  pointer pVVar1;
  float fVar2;
  float s;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vec3 VVar3;
  Vec3 segmentStartPoint;
  Vec3 local_58;
  undefined1 local_48 [24];
  
  pVVar1 = (this->points_).super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_58.z = pVVar1[segmentIndex].z;
  pVVar1 = pVVar1 + segmentIndex;
  local_58.x = pVVar1->x;
  local_58.y = pVVar1->y;
  VVar3 = Vec3::operator-(point,&local_58);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = VVar3._0_8_;
  local_48._12_4_ = extraout_XMM0_Dd;
  Vec3::operator=(tangent,(this->segmentTangents_).
                          super__Vector_base<OpenSteer::Vec3,_std::allocator<OpenSteer::Vec3>_>.
                          _M_impl.super__Vector_impl_data._M_start + segmentIndex);
  fVar2 = VVar3.z * tangent->z +
          tangent->x * (float)local_48._0_4_ + (float)local_48._4_4_ * tangent->y;
  *distance = fVar2;
  s = 0.0;
  if ((0.0 <= fVar2) &&
     (s = (this->segmentLengths_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[segmentIndex], fVar2 <= s)) {
    s = fVar2;
  }
  *distance = s;
  VVar3 = Vec3::operator*(tangent,s);
  pointOnPath->x = local_58.x + VVar3.x;
  pointOnPath->y = local_58.y + VVar3.y;
  pointOnPath->z = VVar3.z + local_58.z;
  return;
}

Assistant:

void 
OpenSteer::PolylineSegmentedPath::mapPointToSegmentDistanceAndPointAndTangent( size_type segmentIndex,
                                                                               Vec3 const& point,
                                                                               float& distance,
                                                                               Vec3& pointOnPath,
                                                                               Vec3& tangent ) const
{
    assert( segmentIndex < segmentCount() && "segmentIndex is out of range." );
    
    Vec3 const segmentStartPoint = points_[ segmentIndex ];
    Vec3 const segmentStartToPoint( point - segmentStartPoint );
    tangent = segmentTangents_[ segmentIndex ];
    distance = segmentStartToPoint.dot( tangent );
    distance =  clamp( distance, 0.0f, segmentLengths_[ segmentIndex ] );
    pointOnPath = tangent * distance + segmentStartPoint;
}